

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

poptContext poptGetContext(char *name,int argc,char **argv,poptOption *options,uint flags)

{
  poptContext con;
  poptArgv ppcVar1;
  char *pcVar2;
  size_t sVar3;
  
  con = (poptContext)calloc(1,800);
  if (con == (poptContext)0x0) {
    return (poptContext)0x0;
  }
  con->os = (optionStackEntry *)con;
  con->optionStack[0].argc = argc;
  con->optionStack[0].argv = argv;
  if ((flags & 2) == 0) {
    con->optionStack[0].next = 1;
  }
  ppcVar1 = (poptArgv)calloc((long)(argc + 1),8);
  con->leftovers = ppcVar1;
  con->allocLeftovers = argc + 1;
  con->options = options;
  con->aliases = (poptItem)0x0;
  con->numAliases = 0;
  con->flags = flags;
  con->execs = (poptItem)0x0;
  con->numExecs = 0;
  con->execFail = (char *)0x0;
  con->finalArgvAlloced = argc * 2;
  ppcVar1 = (poptArgv)calloc((long)(argc * 2),8);
  con->finalArgv = ppcVar1;
  con->execAbsolute = 1;
  con->arg_strip = (pbm_set *)0x0;
  pcVar2 = getenv("POSIXLY_CORRECT");
  if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("POSIX_ME_HARDER"), pcVar2 != (char *)0x0)) {
    con->flags = flags | 4;
  }
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    pcVar2 = (char *)malloc(sVar3 + 1);
    if (pcVar2 == (char *)0x0) {
      fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
      exit(1);
    }
    strcpy(pcVar2,name);
    con->appName = pcVar2;
  }
  invokeCallbacksPRE(con,options);
  return con;
}

Assistant:

poptContext poptGetContext(const char * name, int argc, const char ** argv,
			const struct poptOption * options, unsigned int flags)
{
    poptContext con = malloc(sizeof(*con));

    if (con == NULL) return NULL;	/* XXX can't happen */
    memset(con, 0, sizeof(*con));

    con->os = con->optionStack;
    con->os->argc = argc;
    con->os->argv = argv;
    con->os->argb = NULL;

    if (!(flags & POPT_CONTEXT_KEEP_FIRST))
	con->os->next = 1;		/* skip argv[0] */

    con->leftovers = calloc( (size_t)(argc + 1), sizeof(*con->leftovers) );
    con->allocLeftovers = argc + 1;
    con->options = options;
    con->aliases = NULL;
    con->numAliases = 0;
    con->flags = flags;
    con->execs = NULL;
    con->numExecs = 0;
    con->execFail = NULL;
    con->finalArgvAlloced = argc * 2;
    con->finalArgv = calloc( (size_t)con->finalArgvAlloced, sizeof(*con->finalArgv) );
    con->execAbsolute = 1;
    con->arg_strip = NULL;

    if (getenv("POSIXLY_CORRECT") || getenv("POSIX_ME_HARDER"))
	con->flags |= POPT_CONTEXT_POSIXMEHARDER;

    if (name)
	con->appName = xstrdup(name);

    invokeCallbacksPRE(con, con->options);

    return con;
}